

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall
Parser_repeatedMathParsePrintBehaviourWithReset_Test::
~Parser_repeatedMathParsePrintBehaviourWithReset_Test
          (Parser_repeatedMathParsePrintBehaviourWithReset_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, repeatedMathParsePrintBehaviourWithReset)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <units name=\"blob\"/>\n"
        "  <component name=\"component\">\n"
        "    <variable name=\"variable1\" units=\"blob\" id=\"v1id\"/>\n"
        "    <variable name=\"variable2\" units=\"blob\" id=\"v2id\"/>\n"
        "    <reset variable=\"variable1\" test_variable=\"variable2\" order=\"1\" id=\"r1id\">\n"
        "      <test_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\" id=\"math1when1\">\n"
        "          <apply>\n"
        "            <eq/>\n"
        "            <ci>variable1</ci>\n"
        "            <cn>3.4</cn>\n"
        "          </apply>\n"
        "        </math>\n"
        "      </test_value>\n"
        "      <reset_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\" id=\"math2when1\">\n"
        "          <apply>\n"
        "            <eq/>\n"
        "            <ci>variable1</ci>\n"
        "            <cn>9.0</cn>\n"
        "          </apply>\n"
        "        </math>\n"
        "      </reset_value>\n"
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::PrinterPtr printer = libcellml::Printer::create();

    libcellml::ModelPtr model1 = parser->parseModel(in);
    std::string output1 = printer->printModel(model1);

    libcellml::ModelPtr model2 = parser->parseModel(output1);
    std::string output2 = printer->printModel(model2);

    EXPECT_EQ(in, output2);
}